

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Normalization.hpp
# Opt level: O2

RealConstantType *
Kernel::InequalityNormalizer::qGcd<Kernel::RealConstantType>
          (RealConstantType *__return_storage_ptr__,RealConstantType *l,RealConstantType *r)

{
  IntegerConstantType IStack_38;
  IntegerConstantType local_28;
  
  IntegerConstantType::gcd(&local_28,(IntegerConstantType *)l);
  IntegerConstantType::lcm(&IStack_38,&(l->super_RationalConstantType)._den);
  RealConstantType::RealConstantType(__return_storage_ptr__,&local_28,&IStack_38);
  IntegerConstantType::~IntegerConstantType(&IStack_38);
  IntegerConstantType::~IntegerConstantType(&local_28);
  return __return_storage_ptr__;
}

Assistant:

static Numeral qGcd(Numeral l, Numeral r)
    { return Numeral(  l.numerator().gcd(r.numerator()),
                     l.denominator().lcm(r.denominator())); }